

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

void __thiscall
Kernel::InterpretedLiteralEvaluator::InterpretedLiteralEvaluator
          (InterpretedLiteralEvaluator *this,bool doNormalize)

{
  bool bVar1;
  undefined8 *puVar2;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)55>_> *this_00;
  Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *this_01;
  byte in_SIL;
  undefined8 *in_RDI;
  Evaluator *in_stack_ffffffffffffff08;
  Evaluator *elem;
  Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff30;
  DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *in_stack_ffffffffffffff38;
  
  BottomUpTermTransformer::BottomUpTermTransformer
            ((BottomUpTermTransformer *)in_stack_ffffffffffffff10);
  *in_RDI = &PTR_transform_0131e678;
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::Stack
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::DArray
            ((DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::DArray
            ((DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  *(byte *)(in_RDI + 0xb) = in_SIL & 1;
  puVar2 = (undefined8 *)::operator_new(8);
  *puVar2 = 0;
  IntEvaluator::IntEvaluator((IntEvaluator *)in_stack_ffffffffffffff10);
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  puVar2 = (undefined8 *)::operator_new(8);
  *puVar2 = 0;
  RatEvaluator::RatEvaluator((RatEvaluator *)in_stack_ffffffffffffff10);
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  puVar2 = (undefined8 *)::operator_new(8);
  *puVar2 = 0;
  RealEvaluator::RealEvaluator((RealEvaluator *)in_stack_ffffffffffffff10);
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  puVar2 = (undefined8 *)::operator_new(8);
  *puVar2 = 0;
  ConversionEvaluator::ConversionEvaluator((ConversionEvaluator *)in_stack_ffffffffffffff10);
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  puVar2 = (undefined8 *)::operator_new(8);
  *puVar2 = 0;
  EqualityEvaluator::EqualityEvaluator((EqualityEvaluator *)in_stack_ffffffffffffff10);
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  bVar1 = Shell::Options::useACeval(Lib::env);
  if ((bVar1) && (bVar1 = Shell::Options::alasca(Lib::env), !bVar1)) {
    ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_>::ACFunEvaluator
              ((ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_> *)
               in_stack_ffffffffffffff20);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)27>_>::ACFunEvaluator
              ((ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)27>_> *)
               in_stack_ffffffffffffff20);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff38 =
         (DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *)(in_RDI + 1);
    ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)40>_>::ACFunEvaluator
              ((ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)40>_> *)
               in_stack_ffffffffffffff20);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff30 = ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)42>_>::ACFunEvaluator
              ((ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)42>_> *)
               in_stack_ffffffffffffff20);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    this_00 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)55>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)55>_>::ACFunEvaluator
              (this_00);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    elem = (Evaluator *)(in_RDI + 1);
    this_01 = (Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *)::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)57>_>::ACFunEvaluator
              ((ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)57>_> *)this_00)
    ;
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_01,elem);
  }
  Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::ensure
            (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
  Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::ensure
            (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
  return;
}

Assistant:

InterpretedLiteralEvaluator::InterpretedLiteralEvaluator(bool doNormalize) : _normalize(doNormalize)
{
  // For an evaluator to be used it must be pushed onto _evals
  // We search this list, calling canEvaluate on each evaluator
  // An invariant we want to maintain is that for any literal only one
  //  Evaluator will return true for canEvaluate
  _evals.push(new IntEvaluator());
  _evals.push(new RatEvaluator());
  _evals.push(new RealEvaluator());
  _evals.push(new ConversionEvaluator());
  _evals.push(new EqualityEvaluator());

  if(env.options->useACeval() && !env.options->alasca()){
    // Special AC evaluators are added to be tried first for Plus and Multiply
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::INT_PLUS>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::INT_MULTIPLY>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::RAT_PLUS>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::RAT_MULTIPLY>> ());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::REAL_PLUS>> ());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::REAL_MULTIPLY>> ());
  }

  _funEvaluators.ensure(0);
  _predEvaluators.ensure(0);

}